

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O1

bool __thiscall QThreadPoolPrivate::tryStart(QThreadPoolPrivate *this,QRunnable *task)

{
  QThreadPoolThread ***pppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QThreadPoolThread *pQVar4;
  int iVar5;
  int iVar6;
  iterator iVar7;
  
  pDVar3 = (this->allThreads).q_hash.d;
  if ((pDVar3 != (Data *)0x0) && (pDVar3->size != 0)) {
    if (pDVar3 == (Data *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = (int)pDVar3->size;
    }
    iVar6 = (iVar5 - ((int)(this->expiredThreads).super_QList<QThreadPoolThread_*>.d.size +
                     (int)(this->waitingThreads).super_QList<QThreadPoolThread_*>.d.size)) +
            this->reservedThreads;
    iVar5 = 1;
    if (1 < this->requestedMaxThreadCount) {
      iVar5 = this->requestedMaxThreadCount;
    }
    if ((this->reservedThreads < iVar6) && (iVar5 <= iVar6)) {
      return false;
    }
    if ((this->waitingThreads).super_QList<QThreadPoolThread_*>.d.size != 0) {
      enqueueTask(this,task,0);
      iVar7 = QList<QThreadPoolThread_*>::begin
                        (&(this->waitingThreads).super_QList<QThreadPoolThread_*>);
      pQVar4 = *iVar7.i;
      pppQVar1 = &(this->waitingThreads).super_QList<QThreadPoolThread_*>.d.ptr;
      *pppQVar1 = *pppQVar1 + 1;
      pqVar2 = &(this->waitingThreads).super_QList<QThreadPoolThread_*>.d.size;
      *pqVar2 = *pqVar2 + -1;
      QWaitCondition::wakeOne(&pQVar4->runnableReady);
      return true;
    }
    if ((this->expiredThreads).super_QList<QThreadPoolThread_*>.d.size != 0) {
      iVar7 = QList<QThreadPoolThread_*>::begin
                        (&(this->expiredThreads).super_QList<QThreadPoolThread_*>);
      pQVar4 = *iVar7.i;
      pppQVar1 = &(this->expiredThreads).super_QList<QThreadPoolThread_*>.d.ptr;
      *pppQVar1 = *pppQVar1 + 1;
      pqVar2 = &(this->expiredThreads).super_QList<QThreadPoolThread_*>.d.size;
      *pqVar2 = *pqVar2 + -1;
      this->activeThreads = this->activeThreads + 1;
      pQVar4->runnable = task;
      QThread::wait(&pQVar4->super_QThread,(void *)0x7fffffffffffffff);
      QThread::start(&pQVar4->super_QThread,this->threadPriority);
      return true;
    }
  }
  startThread(this,task);
  return true;
}

Assistant:

bool QThreadPoolPrivate::tryStart(QRunnable *task)
{
    Q_ASSERT(task != nullptr);
    if (allThreads.isEmpty()) {
        // always create at least one thread
        startThread(task);
        return true;
    }

    // can't do anything if we're over the limit
    if (areAllThreadsActive())
        return false;

    if (!waitingThreads.isEmpty()) {
        // recycle an available thread
        enqueueTask(task);
        waitingThreads.takeFirst()->runnableReady.wakeOne();
        return true;
    }

    if (!expiredThreads.isEmpty()) {
        // restart an expired thread
        QThreadPoolThread *thread = expiredThreads.dequeue();
        Q_ASSERT(thread->runnable == nullptr);

        ++activeThreads;

        thread->runnable = task;

        // Ensure that the thread has actually finished, otherwise the following
        // start() has no effect.
        thread->wait();
        Q_ASSERT(thread->isFinished());
        thread->start(threadPriority);
        return true;
    }

    // start a new thread
    startThread(task);
    return true;
}